

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

Result * __thiscall
deqp::gles31::Functional::anon_unknown_1::TransformFeedbackHandler<tcu::Vector<float,_3>_>::
renderAndGetPrimitives
          (Result *__return_storage_ptr__,TransformFeedbackHandler<tcu::Vector<float,_3>_> *this,
          deUint32 programGL,deUint32 tfPrimTypeGL,int numBindings,VertexArrayBinding *bindings,
          int numVertices)

{
  Result *pRVar1;
  int iVar2;
  GLenum GVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  void *pvVar5;
  char *__rhs;
  ulong uVar6;
  TestError *this_00;
  uint uVar7;
  ulong uVar8;
  int numBytes;
  Result *local_130;
  _Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  Functions *gl;
  
  local_130 = __return_storage_ptr__;
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar2);
  (*gl->bindTransformFeedback)(0x8e22,(this->m_tf).super_ObjectWrapper.m_object);
  (*gl->bindBuffer)(0x8c8e,(this->m_tfBuffer).super_ObjectWrapper.m_object);
  (*gl->bindBufferBase)(0x8c8e,0,(this->m_tfBuffer).super_ObjectWrapper.m_object);
  (*gl->beginQuery)(0x8c88,(this->m_tfPrimQuery).super_ObjectWrapper.m_object);
  (*gl->beginTransformFeedback)(tfPrimTypeGL);
  local_110._M_dataplus._M_p._0_4_ = 7;
  local_110._M_dataplus._M_p._4_4_ = numVertices;
  local_110._M_string_length._0_4_ = 3;
  local_110.field_2._M_allocated_capacity = 0;
  glu::draw(this->m_renderCtx,programGL,numBindings,bindings,(PrimitiveList *)&local_110,
            (DrawUtilCallback *)0x0);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"Draw failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                  ,0x15e);
  (*gl->endTransformFeedback)();
  (*gl->endQuery)(0x8c88);
  dVar4 = getQueryResult(gl,(this->m_tfPrimQuery).super_ObjectWrapper.m_object);
  if (tfPrimTypeGL < 5) {
    iVar2 = *(int *)(&DAT_01890e1c + (ulong)tfPrimTypeGL * 4);
  }
  else {
    iVar2 = -1;
  }
  uVar7 = iVar2 * dVar4;
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
            ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)&local_128,
             (long)(int)uVar7,(allocator_type *)&local_110);
  numBytes = uVar7 * 0xc;
  pvVar5 = (*gl->mapBufferRange)(0x8c8e,0,(long)numBytes,1);
  pRVar1 = local_130;
  GVar3 = (*gl->getError)();
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  std::operator+(&local_b0,&local_d0,"glMapBufferRange(");
  __rhs = glu::getBufferTargetName(0x8c8e);
  std::operator+(&local_90,&local_b0,__rhs);
  std::operator+(&local_70,&local_90,", 0, ");
  de::toString<int>(&local_f0,&numBytes);
  std::operator+(&local_50,&local_70,&local_f0);
  std::operator+(&local_110,&local_50,", GL_MAP_READ_BIT)");
  glu::checkError(GVar3,(char *)CONCAT44(local_110._M_dataplus._M_p._4_4_,
                                         local_110._M_dataplus._M_p._0_4_),
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                  ,0x10d);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  if (pvVar5 != (void *)0x0) {
    uVar6 = 0;
    uVar8 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar8 = uVar6;
    }
    for (; uVar8 * 0xc - uVar6 != 0; uVar6 = uVar6 + 0xc) {
      *(undefined4 *)
       ((long)(local_128._M_impl.super__Vector_impl_data._M_start)->m_data + uVar6 + 8) =
           *(undefined4 *)((long)pvVar5 + uVar6 + 8);
      *(undefined8 *)((long)(local_128._M_impl.super__Vector_impl_data._M_start)->m_data + uVar6) =
           *(undefined8 *)((long)pvVar5 + uVar6);
    }
    (*gl->unmapBuffer)(0x8c8e);
    pRVar1->numPrimitives = dVar4;
    std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
              (&pRVar1->varying,
               (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)&local_128)
    ;
    std::_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~_Vector_base
              (&local_128);
    return pRVar1;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"mappedData != DE_NULL",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
             ,0x10e);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

typename TransformFeedbackHandler<AttribType>::Result TransformFeedbackHandler<AttribType>::renderAndGetPrimitives (deUint32 programGL, deUint32 tfPrimTypeGL, int numBindings, const glu::VertexArrayBinding* bindings, int numVertices) const
{
	DE_ASSERT(tfPrimTypeGL == GL_POINTS || tfPrimTypeGL == GL_LINES || tfPrimTypeGL == GL_TRIANGLES);

	const glw::Functions& gl = m_renderCtx.getFunctions();

	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, *m_tf);
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, *m_tfBuffer);
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, *m_tfBuffer);

	gl.beginQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN, *m_tfPrimQuery);
	gl.beginTransformFeedback(tfPrimTypeGL);

	glu::draw(m_renderCtx, programGL, numBindings, bindings, glu::pr::Patches(numVertices));
	GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");

	gl.endTransformFeedback();
	gl.endQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN);

	{
		const int numPrimsWritten = (int)getQueryResult(gl, *m_tfPrimQuery);
		return Result(numPrimsWritten, readDataMapped<AttribType>(gl, GL_TRANSFORM_FEEDBACK_BUFFER, numPrimsWritten * numVerticesPerPrimitive(tfPrimTypeGL)));
	}
}